

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::aLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Plan *pPVar4;
  Plan *pPVar5;
  bool bVar6;
  undefined1 auVar7 [8];
  char cVar8;
  ostream *poVar9;
  undefined1 auVar10 [8];
  size_t *psVar11;
  clock_t cVar12;
  bool bVar13;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  long lVar16;
  Station *this_00;
  Station *station;
  char *pcVar17;
  int iVar18;
  long lVar19;
  double local_c8;
  int local_a4;
  double local_a0;
  undefined1 local_98 [16];
  size_t local_88;
  int local_80;
  int local_7c;
  undefined1 local_78 [8];
  Plan *pPStack_70;
  size_t local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  Station *local_50;
  _List_node_base *local_48;
  Station *local_40;
  _List_node_base *local_38;
  
  local_7c = this->ls_type;
  local_98._0_8_ = local_98;
  local_88 = 0;
  this_00 = (Station *)P;
  local_98._8_8_ = local_98._0_8_;
  local_58 = (_Base_ptr)max_time;
  local_c8 = Plan::getEvaluation(P);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Staring aperture local search...",0x20);
    cVar8 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    this_00 = (Station *)(ulong)(uint)(int)cVar8;
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  local_60 = (_Base_ptr)clock();
  local_a4 = -1;
  local_80 = -1;
  auVar10 = (undefined1  [8])(Plan *)0x0;
  local_a0 = local_c8;
  do {
    getShuffledApertureNeighbors
              ((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                *)local_78,(ApertureILS *)this_00,P);
    pPVar5 = pPStack_70;
    auVar7 = local_78;
    local_78 = (undefined1  [8])0x0;
    pPStack_70 = (Plan *)0x0;
    local_68 = 0;
    if (auVar10 != (undefined1  [8])0x0) {
      operator_delete((void *)auVar10);
    }
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
    local_80 = local_80 + 1;
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Neighborhood ",0xd);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," size ",6);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    current ",0xc);
      poVar9 = std::ostream::_M_insert<double>(local_a0);
      cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      this_00 = (Station *)(ulong)(uint)(int)cVar8;
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    auVar10 = (undefined1  [8])P;
    local_40 = (Station *)Plan::getEvaluation(P);
    if ((long)pPVar5 - (long)auVar7 != 0) {
      lVar19 = (long)pPVar5 - (long)auVar7 >> 4;
      local_48 = (_List_node_base *)(lVar19 + -1);
      local_38 = (_List_node_base *)(lVar19 + (ulong)(lVar19 == 0));
      p_Var15 = (_List_node_base *)0x0;
      bVar13 = false;
      bVar6 = false;
      do {
        lVar19 = (long)*(int *)((_List_node_base **)auVar7 + (long)p_Var15 * 2);
        p_Var14 = (P->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        if (lVar19 < 1) {
          if (*(int *)((_List_node_base **)auVar7 + (long)p_Var15 * 2) != 0) {
            do {
              p_Var14 = p_Var14->_M_prev;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0);
          }
        }
        else {
          do {
            p_Var14 = p_Var14->_M_next;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
        local_50 = (Station *)p_Var14[1]._M_next;
        iVar1 = *(int *)((long)(_List_node_base **)auVar7 + (long)p_Var15 * 0x10 + 4);
        iVar2 = *(int *)((long)&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                                   *)((long)auVar7 + 8))->_M_t)._M_impl.field_0x0 +
                        (long)p_Var15 * 2 * 8);
        uVar3 = *(uint *)(&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                              *)((long)auVar7 + 8))->_M_t)._M_impl.field_0x4 + (long)p_Var15 * 0x10)
        ;
        if (iVar2 < 0) {
          this_00 = (Station *)(ulong)uVar3;
          local_c8 = closeBeamlet((ApertureILS *)auVar10,uVar3,-iVar2,iVar1,local_50,
                                  (double)local_40,P);
        }
        else {
          this_00 = (Station *)(ulong)uVar3;
          local_c8 = openBeamlet((ApertureILS *)auVar10,uVar3,iVar1,local_50,(double)local_40,P);
        }
        iVar18 = (int)p_Var15;
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  aLS Neighbor ",0xf);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," over station ",0xe);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,local_50->angle);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," aperture ",10);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," beamlet ",9);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," operator ",10);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," result ",8);
          poVar9 = std::ostream::_M_insert<double>(local_c8);
          cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          this_00 = (Station *)(ulong)(uint)(int)cVar8;
          auVar10 = (undefined1  [8])std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
        if (1e-05 < local_a0 - local_c8) {
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"     improvement ",0x11);
            poVar9 = std::ostream::_M_insert<double>(local_c8);
            cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            this_00 = (Station *)(ulong)(uint)(int)cVar8;
            auVar10 = (undefined1  [8])std::ostream::put((char)poVar9);
            std::ostream::flush();
          }
          local_a4 = iVar18;
          if (local_7c == 0) {
            if (local_48 == p_Var15) {
              bVar13 = true;
            }
            bVar6 = true;
            local_a0 = local_c8;
            goto LAB_0012cc2d;
          }
          bVar6 = true;
          local_a0 = local_c8;
        }
        this_00 = local_50;
        Station::undoLast_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   local_78,local_50);
        pPVar5 = (Plan *)local_98._0_8_;
        while (pPVar5 != (Plan *)local_98) {
          pPVar4 = (Plan *)pPVar5->_vptr_Plan;
          operator_delete(pPVar5);
          pPVar5 = pPVar4;
        }
        local_88 = 0;
        if (local_78 == (undefined1  [8])local_78) {
          psVar11 = &local_88;
          local_98._0_8_ = (Plan *)local_98;
          local_98._8_8_ = (Plan *)local_98;
        }
        else {
          pPStack_70->_vptr_Plan = (_func_int **)local_98;
          *(Plan **)&(((Plan *)local_78)->angle2station)._M_t._M_impl = (Plan *)local_98;
          local_88 = local_68;
          psVar11 = &local_68;
          local_98._0_8_ = local_78;
          local_98._8_8_ = pPStack_70;
          local_78 = (undefined1  [8])local_78;
          pPStack_70 = (Plan *)local_78;
        }
        *psVar11 = 0;
        auVar10 = local_78;
        station = local_50;
        while (local_50 = station, auVar10 != (undefined1  [8])local_78) {
          pPVar5 = (Plan *)((Plan *)auVar10)->_vptr_Plan;
          operator_delete((void *)auVar10);
          auVar10 = (undefined1  [8])pPVar5;
          station = local_50;
        }
        if (local_88 != 0) {
          auVar10 = (undefined1  [8])P;
          local_c8 = Plan::incremental_eval
                               (P,station,
                                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 *)local_98);
          this_00 = station;
        }
        if (local_48 == p_Var15) {
          bVar13 = true;
        }
        cVar12 = clock();
        if ((((double)local_58 != 0.0) || (NAN((double)local_58))) &&
           ((double)local_58 <= (double)(cVar12 - (long)local_60) / 1000000.0)) {
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  aLS timed out ",0x10);
            cVar8 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
            this_00 = (Station *)(ulong)(uint)(int)cVar8;
            auVar10 = (undefined1  [8])std::ostream::put(-0x60);
            std::ostream::flush();
          }
          goto LAB_0012cc2d;
        }
        p_Var15 = (_List_node_base *)((long)&p_Var15->_M_next + 1);
        if (p_Var15 == local_38) goto LAB_0012cc2d;
      } while( true );
    }
    bVar6 = false;
    bVar13 = false;
LAB_0012cc2d:
    if ((bool)(local_7c != 0 & bVar6)) {
      lVar19 = (long)local_a4;
      lVar16 = (long)*(int *)((_List_node_base **)auVar7 + lVar19 * 2);
      p_Var15 = (P->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      if (lVar16 < 1) {
        if (*(int *)((_List_node_base **)auVar7 + lVar19 * 2) != 0) {
          do {
            p_Var15 = p_Var15->_M_prev;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0);
        }
      }
      else {
        do {
          p_Var15 = p_Var15->_M_next;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      iVar1 = *(int *)((long)(_List_node_base **)auVar7 + lVar19 * 0x10 + 4);
      iVar2 = *(int *)((long)&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                                 *)((long)auVar7 + 8))->_M_t)._M_impl.field_0x0 + lVar19 * 2 * 8);
      uVar3 = *(uint *)(&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                            *)((long)auVar7 + 8))->_M_t)._M_impl.field_0x4 + lVar19 * 0x10);
      this_00 = (Station *)(ulong)uVar3;
      if (iVar2 < 0) {
        local_c8 = closeBeamlet((ApertureILS *)auVar10,uVar3,-iVar2,iVar1,
                                (Station *)p_Var15[1]._M_next,local_c8,P);
      }
      else {
        local_c8 = openBeamlet((ApertureILS *)auVar10,uVar3,iVar1,(Station *)p_Var15[1]._M_next,
                               local_c8,P);
      }
    }
    cVar12 = clock();
    if ((((double)local_58 != 0.0) || (NAN((double)local_58))) &&
       ((double)local_58 <= (double)(cVar12 - (long)local_60) / 1000000.0)) {
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  aLS timed out ",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        std::ostream::put(-0x60);
        std::ostream::flush();
      }
      goto LAB_0012cd55;
    }
    auVar10 = auVar7;
    if (!bVar6) {
LAB_0012cd55:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  aLS best: ",0xc);
      std::ostream::_M_insert<double>(local_a0);
      pcVar17 = ": [nolo] : ";
      if (bVar13) {
        pcVar17 = ": [lo] : ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar17,(ulong)((byte)~bVar13 & 1) * 2 + 9);
      cVar12 = clock();
      poVar9 = std::ostream::_M_insert<double>((double)local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," :",2);
      poVar9 = std::ostream::_M_insert<double>((double)(cVar12 - (long)local_60) / 1000000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pPVar5 = (Plan *)local_98._0_8_;
      while (pPVar5 != (Plan *)local_98) {
        pPVar4 = (Plan *)(((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)&pPVar5->_vptr_Plan)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(pPVar5);
        pPVar5 = pPVar4;
      }
      if (auVar7 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar7);
      }
      return local_a0;
    }
  } while( true );
}

Assistant:

double ApertureILS::aLocalSearch(Plan& P, double max_time, bool verbose) {
  Station *s;
  std::clock_t time_end, time_begin;
  double used_time;
  double local_best_eval, aux_eval, current_eval;
  bool improvement=true, best_improvement=ls_type;
  vector < pair< pair<int, int>, pair<int, int>> > a_list;
  pair< pair<int, int>, pair<int, int>> tabu;
  pair< pair<int, int>, pair<int,int>> best_move;
  list<pair<int, double> > diff;
  int i,j, best_n, aperture, beamlet, sign;
  bool completed = false;
  best_n = -1;
  j=-1;
  local_best_eval = aux_eval= P.getEvaluation();
  if (verbose)
    cout << "Staring aperture local search..." << endl;
  
  time_begin=clock();
  
  while (improvement) {
    j++;
    a_list = getShuffledApertureNeighbors(P);
    //a_list = getOrderedApertureNeighbors(P);
    improvement = false;
    completed = false;
    
    if (verbose)
      cout << "Neighborhood "<<j<< " size "<< a_list.size() << "    current " << local_best_eval << endl;
    
    current_eval = P.getEvaluation();
    for (i = 0; i < a_list.size(); i++) {
      s = P.get_station(a_list[i].first.first);
      aperture = a_list[i].first.second;
      beamlet = a_list[i].second.second;
      sign = a_list[i].second.first;
            
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, current_eval, P); 
      } else {
        aux_eval = openBeamlet(beamlet, aperture, *s, current_eval, P);
      }

      if (verbose) {
          cout << "  aLS Neighbor " << i << " over station " << s->getAngle() << " aperture " << aperture << " beamlet " << beamlet << " operator " << sign << " result " << aux_eval << endl;
      }

      if ((local_best_eval - aux_eval) > 0.00001){
        local_best_eval = aux_eval;
        best_n = i;
        improvement = true;
        if (verbose)
          cout << "     improvement " << aux_eval << endl ;
        if (!best_improvement) { 
          if (i==(a_list.size()-1)) completed=true;
          i = a_list.size();
          break;
        }
      }

      diff = s->undoLast();
      if (diff.size() > 0)
        aux_eval = P.incremental_eval(*s, diff);
      
      if (i==(a_list.size()-1)) completed=true;
      
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        if (verbose)
          cout << "  aLS timed out " << endl;
        break;
      }
      
    }
    
    //Apply best neighbor
    if (improvement && best_improvement) {
      s = P.get_station(a_list[best_n].first.first);
      aperture = a_list[best_n].first.second;
      beamlet = a_list[best_n].second.second;
      sign = a_list[best_n].second.first;
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, aux_eval, P);
      } else{
        aux_eval = openBeamlet(beamlet, aperture, *s, aux_eval, P);
      }
    }
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    if (max_time!=0 && used_time >= max_time) {
      if (verbose)
        cout << "  aLS timed out " << endl;
      break;
    }
  }
  
  cout << "  aLS best: " << local_best_eval ;
  if (!completed) cout << ": [nolo] : ";
  else  cout << ": [lo] : ";
  time_end = clock();
  used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
  cout << max_time << " :" << used_time << endl;
  
  return(local_best_eval);
}